

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_createDependentFunctionType
          (sysbvm_context_t *context,sysbvm_tuple_t argumentNodes,sysbvm_bitflags_t flags,
          sysbvm_tuple_t resultTypeNode,sysbvm_tuple_t environment,sysbvm_tuple_t captureBindings,
          sysbvm_tuple_t argumentBindings,sysbvm_tuple_t localBindings)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_bitflags_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_dependentFunctionType_t *result;
  sysbvm_type_tuple_t *supertype;
  sysbvm_tuple_t captureBindings_local;
  sysbvm_tuple_t environment_local;
  sysbvm_tuple_t resultTypeNode_local;
  sysbvm_bitflags_t flags_local;
  sysbvm_tuple_t argumentNodes_local;
  sysbvm_context_t *context_local;
  
  sVar4 = (context->roots).functionType;
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).dependentFunctionTypeType,0x25);
  psVar1[2].header.field_0.typePointer = sVar4;
  sVar2 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(sVar4 + 0x70));
  sVar3 = sysbvm_tuple_bitflags_encode(sVar2 | 0x1000);
  psVar1[4].field_1.pointers[0] = sVar3;
  psVar1[3].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(sVar4 + 0x58);
  sVar4 = sysbvm_array_create(context,0);
  psVar1[2].header.identityHashAndFlags = (int)sVar4;
  psVar1[2].header.objectSize = (int)(sVar4 >> 0x20);
  sVar4 = sysbvm_tuple_size_encode(context,0);
  psVar1[4].header.field_0.typePointer = sVar4;
  sVar4 = sysbvm_tuple_size_encode(context,0);
  psVar1[4].header.identityHashAndFlags = (int)sVar4;
  psVar1[4].header.objectSize = (int)(sVar4 >> 0x20);
  sVar4 = sysbvm_tuple_bitflags_encode(flags);
  psVar1[10].header.identityHashAndFlags = (int)sVar4;
  psVar1[10].header.objectSize = (int)(sVar4 >> 0x20);
  psVar1[0xb].header.field_0.typePointer = argumentNodes;
  psVar1[0xb].header.identityHashAndFlags = (int)resultTypeNode;
  psVar1[0xb].header.objectSize = (int)(resultTypeNode >> 0x20);
  psVar1[0xb].field_1.pointers[0] = environment;
  psVar1[0xc].header.field_0.typePointer = captureBindings;
  psVar1[0xc].header.identityHashAndFlags = (undefined4)argumentBindings;
  psVar1[0xc].header.objectSize = argumentBindings._4_4_;
  psVar1[0xc].field_1.pointers[0] = localBindings;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createDependentFunctionType(sysbvm_context_t *context, sysbvm_tuple_t argumentNodes, sysbvm_bitflags_t flags, sysbvm_tuple_t resultTypeNode,
    sysbvm_tuple_t environment, sysbvm_tuple_t captureBindings, sysbvm_tuple_t argumentBindings, sysbvm_tuple_t localBindings)
{
    sysbvm_type_tuple_t *supertype = (sysbvm_type_tuple_t*)context->roots.functionType;

    sysbvm_dependentFunctionType_t* result = (sysbvm_dependentFunctionType_t*)sysbvm_context_allocatePointerTuple(context, context->roots.dependentFunctionTypeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_dependentFunctionType_t));
    result->super.super.supertype = (sysbvm_tuple_t)supertype;
    result->super.super.flags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode(supertype->flags) | SYSBVM_TYPE_FLAGS_FUNCTION);
    result->super.super.totalSlotCount = supertype->totalSlotCount;
    result->super.super.slots = sysbvm_array_create(context, 0);
    result->super.super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    result->super.functionFlags = sysbvm_tuple_bitflags_encode(flags);
    result->argumentNodes = argumentNodes;
    result->resultTypeNode = resultTypeNode;

    result->environment = environment;
    result->captureBindings = captureBindings;
    result->argumentBindings = argumentBindings;
    result->localBindings = localBindings;
    return (sysbvm_tuple_t)result;
}